

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void build_eq(Grammar *g)

{
  long *plVar1;
  long *plVar2;
  void *pvVar3;
  uint uVar4;
  State *pSVar5;
  State *pSVar6;
  State *pSVar7;
  State *pSVar8;
  State *pSVar9;
  Action **ppAVar10;
  Action **ppAVar11;
  Rule *pRVar12;
  Rule *pRVar13;
  uint *puVar14;
  uint *puVar15;
  State **ppSVar16;
  long lVar17;
  size_t __size;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  void *__s;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  
  __size = (ulong)(g->states).n * 0x18;
  __s = malloc(__size);
  memset(__s,0,__size);
  do {
    if ((g->states).n == 0) break;
    uVar22 = 1;
    bVar18 = false;
    uVar23 = 0;
    do {
      uVar21 = uVar23 + 1;
      if (uVar21 < (g->states).n) {
        pSVar5 = (g->states).v[uVar23];
        plVar1 = (long *)((long)__s + (ulong)pSVar5->index * 0x18);
        uVar23 = uVar22;
        do {
          if (*plVar1 == 0) {
            pSVar6 = (g->states).v[uVar23];
            plVar2 = (long *)((long)__s + (ulong)pSVar6->index * 0x18);
            if ((*plVar2 == 0) &&
               (((pSVar5->same_shifts == pSVar6->same_shifts || (pSVar6->same_shifts == pSVar5)) &&
                ((pSVar5->gotos).n == (pSVar6->gotos).n)))) {
              if ((pSVar5->gotos).n != 0) {
                uVar24 = 0;
                do {
                  uVar19 = elem_symbol(g,(pSVar5->gotos).v[uVar24]->elem);
                  uVar20 = elem_symbol(g,(pSVar6->gotos).v[uVar24]->elem);
                  if (uVar19 != uVar20) goto LAB_0013d149;
                  pSVar7 = (pSVar5->gotos).v[uVar24]->state;
                  pSVar8 = (pSVar6->gotos).v[uVar24]->state;
                  if (pSVar7 != pSVar8) {
                    pSVar9 = *(State **)((long)__s + (ulong)pSVar7->index * 0x18);
                    if ((((pSVar9 != pSVar8) &&
                         (*(State **)((long)__s + (ulong)pSVar8->index * 0x18) != pSVar7)) ||
                        ((plVar2[2] != 0 &&
                         (plVar2[2] != *(long *)((long)__s + (ulong)pSVar8->index * 0x18))))) ||
                       (((State *)plVar1[2] != (State *)0x0 && ((State *)plVar1[2] != pSVar9))))
                    goto LAB_0013d149;
                    plVar2[2] = (long)pSVar8;
                    plVar1[2] = (long)pSVar7;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 < (pSVar5->gotos).n);
              }
              uVar4 = (pSVar5->reduce_actions).n;
              if (uVar4 == (pSVar6->reduce_actions).n) {
                if ((ulong)uVar4 != 0) {
                  ppAVar10 = (pSVar5->reduce_actions).v;
                  ppAVar11 = (pSVar6->reduce_actions).v;
                  uVar24 = 0;
                  do {
                    pRVar12 = ppAVar10[uVar24]->rule;
                    pRVar13 = ppAVar11[uVar24]->rule;
                    if (pRVar12 != pRVar13) {
                      if (pRVar12->prod != pRVar13->prod) goto LAB_0013d149;
                      if ((pRVar12->elems).n != (pRVar13->elems).n) {
                        if ((((Rule *)plVar2[1] != (Rule *)0x0) && ((Rule *)plVar2[1] != pRVar13))
                           || (((Rule *)plVar1[1] != (Rule *)0x0 && ((Rule *)plVar1[1] != pRVar12)))
                           ) goto LAB_0013d149;
                        plVar2[1] = (long)pRVar13;
                        plVar1[1] = (long)pRVar12;
                      }
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar4 != uVar24);
                }
                *plVar2 = (long)pSVar5;
                bVar18 = true;
              }
            }
          }
LAB_0013d149:
          uVar23 = uVar23 + 1;
        } while (uVar23 < (g->states).n);
      }
      uVar22 = uVar22 + 1;
      uVar23 = uVar21;
    } while (uVar21 < (g->states).n);
  } while (bVar18);
  uVar4 = (g->states).n;
  uVar23 = (ulong)uVar4;
  if (uVar4 != 0) {
    uVar22 = 0;
    do {
      uVar23 = (ulong)(g->states).v[uVar22]->index;
      puVar14 = *(uint **)((long)__s + uVar23 * 0x18);
      if ((puVar14 != (uint *)0x0) && (2 < d_verbose_level)) {
        printf("eq %d %d ",uVar23,(ulong)*puVar14);
        puVar15 = *(uint **)((long)__s + uVar23 * 0x18 + 0x10);
        if (puVar15 != (uint *)0x0) {
          printf("diff state (%d %d) ",(ulong)*puVar15,
                 (ulong)**(uint **)((long)__s + (ulong)*puVar14 * 0x18 + 0x10));
        }
        pRVar12 = *(Rule **)((long)__s + uVar23 * 0x18 + 8);
        if (pRVar12 != (Rule *)0x0) {
          printf("diff rule ");
          printf("[ ");
          print_rule(pRVar12);
          printf("][ ");
          print_rule(*(Rule **)((long)__s + (ulong)*puVar14 * 0x18 + 8));
          putchar(0x5d);
        }
        putchar(10);
      }
      uVar22 = uVar22 + 1;
      uVar23 = (ulong)(g->states).n;
    } while (uVar22 < uVar23);
  }
  if ((int)uVar23 != 0) {
    ppSVar16 = (g->states).v;
    uVar22 = 0;
    do {
      pSVar5 = ppSVar16[uVar22];
      pSVar6 = *(State **)((long)__s + (ulong)pSVar5->index * 0x18);
      if (pSVar6 != (State *)0x0) {
        pvVar3 = (void *)((long)__s + (ulong)pSVar5->index * 0x18);
        if (*(uint **)((long)pvVar3 + 0x10) != (uint *)0x0) {
          lVar17 = *(long *)((long)__s + (ulong)**(uint **)((long)pvVar3 + 0x10) * 0x18 + 8);
          if ((lVar17 == 0) || (*(int *)(lVar17 + 0x20) != 2)) {
            uVar4 = pSVar6->index;
            lVar17 = *(long *)((long)__s +
                              (ulong)**(uint **)((long)__s + (ulong)uVar4 * 0x18 + 0x10) * 0x18 + 8)
            ;
            if ((lVar17 == 0) || (*(int *)(lVar17 + 0x20) != 2)) goto LAB_0013d327;
            pSVar6->reduces_to = pSVar5;
            pSVar5->reduces_with = *(Rule **)((long)pvVar3 + 8);
            pvVar3 = (void *)((long)__s + (ulong)uVar4 * 0x18);
          }
          else {
            pSVar5->reduces_to = pSVar6;
            pSVar5->reduces_with = *(Rule **)((long)__s + (ulong)pSVar6->index * 0x18 + 8);
          }
          pSVar5->reduces_to_then_with = *(Rule **)((long)pvVar3 + 8);
        }
      }
LAB_0013d327:
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
  }
  if ((g->states).n != 0) {
    uVar23 = 0;
    do {
      pSVar5 = (g->states).v[uVar23];
      pSVar6 = pSVar5->reduces_to;
      if ((pSVar6 != (State *)0x0) && (d_verbose_level != 0)) {
        printf("reduces_to %d %d\n",(ulong)pSVar5->index,(ulong)pSVar6->index);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < (g->states).n);
  }
  free(__s);
  return;
}

Assistant:

void build_eq(Grammar *g) {
  uint i, j, k, changed = 1, x, xx;
  State *s, *ss;
  EqState *eq, *e, *ee;

  eq = (EqState *)MALLOC(sizeof(EqState) * g->states.n);
  memset(eq, 0, sizeof(EqState) * g->states.n);
  while (changed) {
    changed = 0;
    for (i = 0; i < g->states.n; i++) {
      s = g->states.v[i];
      e = &eq[s->index];
      for (j = i + 1; j < g->states.n; j++) {
        ss = g->states.v[j];
        ee = &eq[ss->index];
        if (e->eq || ee->eq) continue;
        if (s->same_shifts != ss->same_shifts && ss->same_shifts != s) continue;
        /* check gotos */
        if (s->gotos.n != ss->gotos.n) continue;
        for (k = 0; k < s->gotos.n; k++) {
          if (elem_symbol(g, s->gotos.v[k]->elem) != elem_symbol(g, ss->gotos.v[k]->elem)) goto Lcontinue;
          if (s->gotos.v[k]->state != ss->gotos.v[k]->state) {
            EqState *ge = &eq[s->gotos.v[k]->state->index];
            EqState *gee = &eq[ss->gotos.v[k]->state->index];
            if (ge->eq != ss->gotos.v[k]->state && gee->eq != s->gotos.v[k]->state) goto Lcontinue;
            if ((ee->diff_state && ee->diff_state != eq[ss->gotos.v[k]->state->index].eq) ||
                (e->diff_state && e->diff_state != eq[s->gotos.v[k]->state->index].eq))
              goto Lcontinue;
            /* allow one different state */
            ee->diff_state = ss->gotos.v[k]->state;
            e->diff_state = s->gotos.v[k]->state;
          }
        }
        /* check reductions */
        if (s->reduce_actions.n != ss->reduce_actions.n) continue;
        for (k = 0; k < s->reduce_actions.n; k++) {
          if (s->reduce_actions.v[k]->rule == ss->reduce_actions.v[k]->rule) continue;
          if (s->reduce_actions.v[k]->rule->prod != ss->reduce_actions.v[k]->rule->prod) goto Lcontinue;
          if ((x = s->reduce_actions.v[k]->rule->elems.n) != (xx = ss->reduce_actions.v[k]->rule->elems.n)) {
            if ((ee->diff_rule && ee->diff_rule != ss->reduce_actions.v[k]->rule) ||
                (e->diff_rule && e->diff_rule != s->reduce_actions.v[k]->rule))
              goto Lcontinue;
            /* allow one different rule */
            ee->diff_rule = ss->reduce_actions.v[k]->rule;
            e->diff_rule = s->reduce_actions.v[k]->rule;
          }
        }
        ee->eq = s;
        changed = 1;
      Lcontinue:;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq) {
      if (d_verbose_level > 2) {
        printf("eq %d %d ", s->index, e->eq->index);
        if (e->diff_state) printf("diff state (%d %d) ", e->diff_state->index, eq[e->eq->index].diff_state->index);
        if (e->diff_rule) {
          printf("diff rule ");
          printf("[ ");
          print_rule(e->diff_rule);
          printf("][ ");
          print_rule(eq[e->eq->index].diff_rule);
          printf("]");
        }
        printf("\n");
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq && e->diff_state) {
      if (eq[e->diff_state->index].diff_rule && eq[e->diff_state->index].diff_rule->elems.n == 2) {
        s->reduces_to = e->eq;
        s->reduces_with = eq[e->eq->index].diff_rule;
        s->reduces_to_then_with = e->diff_rule;
      } else if (eq[eq[e->eq->index].diff_state->index].diff_rule &&
                 eq[eq[e->eq->index].diff_state->index].diff_rule->elems.n == 2) {
        e->eq->reduces_to = s;
        s->reduces_with = e->diff_rule;
        s->reduces_to_then_with = eq[e->eq->index].diff_rule;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->reduces_to)
      if (d_verbose_level) printf("reduces_to %d %d\n", s->index, s->reduces_to->index);
  }
  FREE(eq);
}